

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

mu_Rect mu_layout_next(mu_Context *ctx)

{
  int iVar1;
  mu_Style *pmVar2;
  mu_Layout *layout;
  int iVar3;
  int iVar4;
  mu_Vec2 *pmVar5;
  int iVar6;
  mu_Vec2 mVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar1 = (ctx->layout_stack).idx;
  layout = (mu_Layout *)(long)iVar1;
  pmVar2 = ctx->style;
  layout = (mu_Layout *)(long)iVar1;
  iVar9 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next_type;
  if (iVar9 == 0) {
    layout = (mu_Layout *)(long)iVar1;
    iVar9 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].items;
    layout = (mu_Layout *)(long)iVar1;
    iVar11 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].item_index;
    if (iVar11 == iVar9) {
      layout = (mu_Layout *)(long)iVar1;
      iVar3 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next_row;
      layout = (mu_Layout *)(long)iVar1;
      iVar10 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].indent;
      mVar7.y = iVar3;
      mVar7.x = iVar10;
      layout = (mu_Layout *)(long)iVar1;
      (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].position = mVar7;
      layout = (mu_Layout *)(long)iVar1;
      (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].item_index = 0;
      iVar11 = 0;
    }
    else {
      layout = (mu_Layout *)(long)iVar1;
      iVar10 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].position.x;
      layout = (mu_Layout *)(long)iVar1;
      iVar3 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].position.y;
    }
    layout = (mu_Layout *)(long)iVar1;
    layout = (mu_Layout *)(long)iVar1;
    pmVar5 = (mu_Vec2 *)
             ((long)(ctx->layout_stack).items + (long)iVar11 * 4 + (long)layout * 0x8c + -0x54);
    if (iVar9 < 1) {
      pmVar5 = &(ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].size;
    }
    iVar4 = pmVar5->x;
    layout = (mu_Layout *)(long)iVar1;
    iVar6 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].size.y;
    if (iVar4 == 0) {
      iVar4 = pmVar2->padding * 2 + (pmVar2->size).x;
    }
    if (iVar6 == 0) {
      iVar6 = pmVar2->padding * 2 + (pmVar2->size).y;
    }
    if (iVar4 < 0) {
      layout = (mu_Layout *)(long)iVar1;
      iVar4 = (iVar4 - iVar10) + *(int *)((long)&ctx->id_stack + (long)layout * 0x8c + 4) + 1;
    }
    if (iVar6 < 0) {
      layout = (mu_Layout *)(long)iVar1;
      iVar6 = (iVar6 - iVar3) +
              (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].body.h + 1;
    }
    layout = (mu_Layout *)(long)iVar1;
    (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].item_index = iVar11 + 1;
    iVar9 = iVar10;
  }
  else {
    layout = (mu_Layout *)(long)iVar1;
    (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next_type = 0;
    layout = (mu_Layout *)(long)iVar1;
    iVar10 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next.x;
    layout = (mu_Layout *)(long)iVar1;
    iVar3 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next.y;
    layout = (mu_Layout *)(long)iVar1;
    iVar4 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next.w;
    layout = (mu_Layout *)(long)iVar1;
    iVar6 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next.h;
    if (iVar9 == 2) goto LAB_0013d56c;
    layout = (mu_Layout *)(long)iVar1;
    iVar9 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].position.x;
  }
  iVar11 = pmVar2->spacing;
  layout = (mu_Layout *)(long)iVar1;
  (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].position.x =
       iVar9 + iVar11 + iVar4;
  layout = (mu_Layout *)(long)iVar1;
  iVar9 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next_row;
  iVar11 = iVar3 + iVar6 + iVar11;
  if (iVar11 < iVar9) {
    iVar11 = iVar9;
  }
  layout = (mu_Layout *)(long)iVar1;
  (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].next_row = iVar11;
  iVar10 = iVar10 + *(int *)((long)&ctx->id_stack + (long)layout * 0x8c + -4);
  layout = (mu_Layout *)(long)iVar1;
  iVar3 = iVar3 + *(int *)((long)&ctx->id_stack + (long)layout * 0x8c);
  layout = (mu_Layout *)(long)iVar1;
  iVar9 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].max.x;
  layout = (mu_Layout *)(long)iVar1;
  iVar11 = (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].max.y;
  iVar8 = iVar10 + iVar4;
  if (iVar10 + iVar4 < iVar9) {
    iVar8 = iVar9;
  }
  layout = (mu_Layout *)(long)iVar1;
  (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].max.x = iVar8;
  iVar9 = iVar3 + iVar6;
  if (iVar3 + iVar6 < iVar11) {
    iVar9 = iVar11;
  }
  layout = (mu_Layout *)(long)iVar1;
  (ctx->layout_stack).items[(long)((long)&layout[-1].indent + 3)].max.y = iVar9;
LAB_0013d56c:
  (ctx->last_rect).x = iVar10;
  (ctx->last_rect).y = iVar3;
  (ctx->last_rect).w = iVar4;
  (ctx->last_rect).h = iVar6;
  return ctx->last_rect;
}

Assistant:

mu_Rect mu_layout_next(mu_Context *ctx) {
  mu_Layout *layout = get_layout(ctx);
  mu_Style *style = ctx->style;
  mu_Rect res;

  if (layout->next_type) {
    /* handle rect set by `mu_layout_set_next` */
    int type = layout->next_type;
    layout->next_type = 0;
    res = layout->next;
    if (type == ABSOLUTE) { return (ctx->last_rect = res); }

  } else {
    /* handle next row */
    if (layout->item_index == layout->items) {
      mu_layout_row(ctx, layout->items, NULL, layout->size.y);
    }

    /* position */
    res.x = layout->position.x;
    res.y = layout->position.y;

    /* size */
    res.w = layout->items > 0 ? layout->widths[layout->item_index] : layout->size.x;
    res.h = layout->size.y;
    if (res.w == 0) { res.w = style->size.x + style->padding * 2; }
    if (res.h == 0) { res.h = style->size.y + style->padding * 2; }
    if (res.w <  0) { res.w += layout->body.w - res.x + 1; }
    if (res.h <  0) { res.h += layout->body.h - res.y + 1; }

    layout->item_index++;
  }

  /* update position */
  layout->position.x += res.w + style->spacing;
  layout->next_row = mu_max(layout->next_row, res.y + res.h + style->spacing);

  /* apply body offset */
  res.x += layout->body.x;
  res.y += layout->body.y;

  /* update max position */
  layout->max.x = mu_max(layout->max.x, res.x + res.w);
  layout->max.y = mu_max(layout->max.y, res.y + res.h);

  return (ctx->last_rect = res);
}